

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::fuse_innerproduct_dropout(NetOptimize *this)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  Layer *pLVar4;
  int *piVar5;
  pointer ppLVar6;
  Layer *pLVar7;
  size_type sVar8;
  bool bVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int i;
  pointer piVar13;
  ulong uVar14;
  ulong uVar15;
  int j;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  ulong local_48;
  
  uVar18 = (ulong)((long)(this->super_Net).layers.
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->super_Net).layers.
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 3;
  iVar17 = (int)uVar18;
  uVar11 = 0;
  if (0 < iVar17) {
    uVar11 = uVar18 & 0xffffffff;
  }
  local_48 = 1;
  uVar18 = 0;
  do {
    if (uVar18 == uVar11) {
      return 0;
    }
    bVar9 = std::operator!=(&(this->super_Net).layers.
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar18]->type,"InnerProduct");
    if (!bVar9) {
      iVar2 = *((this->super_Net).layers.
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar18]->tops).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      for (uVar14 = local_48; (int)uVar14 < iVar17; uVar14 = uVar14 + 1) {
        bVar9 = std::operator!=(&(this->super_Net).layers.
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar14]->type,"Dropout");
        if (((!bVar9) &&
            (pLVar4 = (this->super_Net).layers.
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar14],
            piVar5 = (pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            (long)*(pointer *)
                   ((long)&(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl +
                   8) - (long)piVar5 == 4)) && (*piVar5 == iVar2)) {
          if ((int)uVar14 != iVar17) {
            ppLVar6 = (this->super_Net).layers.
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar4 = ppLVar6[uVar18];
            pLVar7 = ppLVar6[uVar14 & 0xffffffff];
            fprintf(_stderr,"fuse_innerproduct_dropout %s %s\n",(pLVar4->name)._M_dataplus._M_p,
                    (pLVar7->name)._M_dataplus._M_p);
            fVar1 = *(float *)&pLVar7[1]._vptr_Layer;
            if (fVar1 != 1.0) {
              uVar3 = *(uint *)&pLVar4[1]._vptr_Layer;
              uVar10 = *(int *)&pLVar4[1].one_blob_only / (int)uVar3;
              piVar13 = *(pointer *)
                         ((long)&pLVar4[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl + 8);
              uVar14 = 0;
              if (0 < (int)uVar10) {
                uVar14 = (ulong)uVar10;
              }
              uVar12 = (ulong)uVar3;
              if ((int)uVar3 < 1) {
                uVar12 = 0;
              }
              for (uVar15 = 0; uVar15 != uVar12; uVar15 = uVar15 + 1) {
                for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
                  piVar13[uVar16] = (int)((float)piVar13[uVar16] * fVar1);
                }
                piVar13 = piVar13 + (int)uVar10;
              }
              if (*(int *)((long)&pLVar4[1]._vptr_Layer + 4) != 0) {
                sVar8 = pLVar4[2].type._M_string_length;
                for (uVar14 = 0; uVar12 != uVar14; uVar14 = uVar14 + 1) {
                  *(float *)(sVar8 + uVar14 * 4) = *(float *)(sVar8 + uVar14 * 4) * fVar1;
                }
              }
            }
            iVar2 = *(pLVar7->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar2;
            (this->super_Net).blobs.super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar2].producer = (int)uVar18;
            std::__cxx11::string::assign((char *)&pLVar7->type);
          }
          break;
        }
      }
    }
    uVar18 = uVar18 + 1;
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_innerproduct_dropout()
{
    const int layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "InnerProduct")
            continue;

        // InnerProduct - Dropout
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "Dropout")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse InnerProduct - Dropout to InnerProduct
        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)layers[i];
        ncnn::Dropout* dropout = (ncnn::Dropout*)layers[j];

        fprintf(stderr, "fuse_innerproduct_dropout %s %s\n", innerproduct->name.c_str(), dropout->name.c_str());

        float scale = dropout->scale;
        if (scale != 1.f)
        {
            const int num_output = innerproduct->num_output;
            const int weight_per_outch = innerproduct->weight_data_size / num_output;

            float* weight = innerproduct->weight_data;
            for (int i=0; i<num_output; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j=0; j<weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= scale;
                }
            }

            if (innerproduct->bias_term)
            {
                float* bias = innerproduct->bias_data;
                for (int i=0; i<num_output; i++)
                {
                    bias[i] *= scale;
                }
            }
        }

        int top_blob_index_final = dropout->tops[0];
        innerproduct->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        dropout->type = "ncnnfused";
    }

    return 0;
}